

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O1

void __thiscall
QDeviceDiscoveryUDev::QDeviceDiscoveryUDev
          (QDeviceDiscoveryUDev *this,QDeviceTypes types,udev *udev,QObject *parent)

{
  int iVar1;
  long lVar2;
  QSocketNotifier *this_00;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> *)(this + 0x10) =
       types.super_QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>.
       super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i;
  *(undefined ***)this = &PTR_metaObject_00156f90;
  *(udev **)(this + 0x18) = udev;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  if (udev != (udev *)0x0) {
    lVar2 = udev_monitor_new_from_netlink(udev,"udev");
    *(long *)(this + 0x20) = lVar2;
    if (lVar2 == 0) {
      QDeviceDiscoveryUDev((QDeviceDiscoveryUDev *)udev);
    }
    else {
      udev_monitor_filter_add_match_subsystem_devtype(lVar2,"input",0);
      udev_monitor_filter_add_match_subsystem_devtype(*(undefined8 *)(this + 0x20),"drm",0);
      udev_monitor_enable_receiving(*(undefined8 *)(this + 0x20));
      iVar1 = udev_monitor_get_fd(*(undefined8 *)(this + 0x20));
      *(int *)(this + 0x28) = iVar1;
      this_00 = (QSocketNotifier *)operator_new(0x10);
      QSocketNotifier::QSocketNotifier(this_00,(long)iVar1,Read,(QObject *)this);
      *(QSocketNotifier **)(this + 0x30) = this_00;
      QObject::connect(local_30,(char *)this_00,(QObject *)"2activated(QSocketDescriptor)",
                       (char *)this,0x149ac1);
      QMetaObject::Connection::~Connection((Connection *)local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDeviceDiscoveryUDev::QDeviceDiscoveryUDev(QDeviceTypes types, struct udev *udev, QObject *parent) :
    QDeviceDiscovery(types, parent),
    m_udev(udev)
{
    if (!m_udev)
        return;

    m_udevMonitor = udev_monitor_new_from_netlink(m_udev, "udev");
    if (!m_udevMonitor) {
        qWarning("Unable to create an udev monitor. No devices can be detected.");
        return;
    }

    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "input", 0);
    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "drm", 0);
    udev_monitor_enable_receiving(m_udevMonitor);
    m_udevMonitorFileDescriptor = udev_monitor_get_fd(m_udevMonitor);

    m_udevSocketNotifier = new QSocketNotifier(m_udevMonitorFileDescriptor, QSocketNotifier::Read, this);
    connect(m_udevSocketNotifier, SIGNAL(activated(QSocketDescriptor)), this, SLOT(handleUDevNotification()));
}